

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_throughput(config config)

{
  config config_00;
  undefined1 auVar1 [80];
  int iVar3;
  redisContext *c_00;
  undefined8 uVar4;
  void *pvVar5;
  longlong lVar6;
  longlong lVar7;
  char *in_stack_ffffffffffffffd0;
  longlong t2;
  longlong t1;
  int num;
  int i;
  redisReply **replies;
  redisContext *c;
  undefined1 auVar2 [32];
  
  auVar1 = config._0_80_;
  config_00.ssl.key = in_stack_ffffffffffffffd0;
  auVar2 = auVar1._8_32_;
  config_00.type = auVar1._0_4_;
  config_00._4_4_ = auVar1._4_4_;
  config_00.tcp.host = (char *)auVar2._0_8_;
  config_00.tcp.port = auVar2._8_4_;
  config_00.tcp._12_4_ = auVar2._12_4_;
  config_00.tcp.timeout.tv_sec = SUB168(auVar2._16_16_,0);
  config_00.tcp.timeout.tv_usec = SUB168(auVar2._16_16_,8);
  config_00.unix_sock.path = (char *)auVar1._40_8_;
  config_00.ssl.host = (char *)auVar1._48_8_;
  config_00.ssl.port = auVar1._56_4_;
  config_00.ssl._12_4_ = auVar1._60_4_;
  config_00.ssl.ca_cert = (char *)auVar1._64_8_;
  config_00.ssl.cert = (char *)auVar1._72_8_;
  c_00 = do_connect(config_00);
  tests = tests + 1;
  printf("#%02d ");
  printf("Throughput:\n");
  for (t1._4_4_ = 0; t1._4_4_ < 500; t1._4_4_ = t1._4_4_ + 1) {
    uVar4 = redisCommand(c_00,"LPUSH mylist foo");
    freeReplyObject(uVar4);
  }
  pvVar5 = malloc(8000);
  lVar6 = usec();
  t1._4_4_ = 0;
  while( true ) {
    if (999 < t1._4_4_) {
      lVar7 = usec();
      for (t1._4_4_ = 0; t1._4_4_ < 1000; t1._4_4_ = t1._4_4_ + 1) {
        freeReplyObject(*(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8));
      }
      free(pvVar5);
      printf("\t(%dx PING: %.3fs)\n",SUB84((double)(lVar7 - lVar6) / 1000000.0,0),1000);
      pvVar5 = malloc(8000);
      lVar6 = usec();
      t1._4_4_ = 0;
      while( true ) {
        if (999 < t1._4_4_) {
          lVar7 = usec();
          for (t1._4_4_ = 0; t1._4_4_ < 1000; t1._4_4_ = t1._4_4_ + 1) {
            freeReplyObject(*(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8));
          }
          free(pvVar5);
          printf("\t(%dx LRANGE with 500 elements: %.3fs)\n",
                 SUB84((double)(lVar7 - lVar6) / 1000000.0,0),1000);
          pvVar5 = malloc(8000);
          lVar6 = usec();
          t1._4_4_ = 0;
          while( true ) {
            if (999 < t1._4_4_) {
              lVar7 = usec();
              for (t1._4_4_ = 0; t1._4_4_ < 1000; t1._4_4_ = t1._4_4_ + 1) {
                freeReplyObject(*(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8));
              }
              free(pvVar5);
              printf("\t(%dx INCRBY: %.3fs)\n",SUB84((double)(lVar7 - lVar6) / 1000000.0,0),1000);
              pvVar5 = malloc(80000);
              for (t1._4_4_ = 0; t1._4_4_ < 10000; t1._4_4_ = t1._4_4_ + 1) {
                redisAppendCommand(c_00,"PING");
              }
              lVar6 = usec();
              t1._4_4_ = 0;
              while( true ) {
                if (9999 < t1._4_4_) {
                  lVar7 = usec();
                  for (t1._4_4_ = 0; t1._4_4_ < 10000; t1._4_4_ = t1._4_4_ + 1) {
                    freeReplyObject(*(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8));
                  }
                  free(pvVar5);
                  printf("\t(%dx PING (pipelined): %.3fs)\n",
                         SUB84((double)(lVar7 - lVar6) / 1000000.0,0),10000);
                  pvVar5 = malloc(80000);
                  for (t1._4_4_ = 0; t1._4_4_ < 10000; t1._4_4_ = t1._4_4_ + 1) {
                    redisAppendCommand(c_00,"LRANGE mylist 0 499");
                  }
                  lVar6 = usec();
                  t1._4_4_ = 0;
                  while( true ) {
                    if (9999 < t1._4_4_) {
                      lVar7 = usec();
                      for (t1._4_4_ = 0; t1._4_4_ < 10000; t1._4_4_ = t1._4_4_ + 1) {
                        freeReplyObject(*(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8));
                      }
                      free(pvVar5);
                      printf("\t(%dx LRANGE with 500 elements (pipelined): %.3fs)\n",
                             SUB84((double)(lVar7 - lVar6) / 1000000.0,0),10000);
                      pvVar5 = malloc(80000);
                      for (t1._4_4_ = 0; t1._4_4_ < 10000; t1._4_4_ = t1._4_4_ + 1) {
                        redisAppendCommand(c_00,"INCRBY incrkey %d",1000000);
                      }
                      lVar6 = usec();
                      t1._4_4_ = 0;
                      while( true ) {
                        if (9999 < t1._4_4_) {
                          lVar7 = usec();
                          for (t1._4_4_ = 0; t1._4_4_ < 10000; t1._4_4_ = t1._4_4_ + 1) {
                            freeReplyObject(*(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8));
                          }
                          free(pvVar5);
                          printf("\t(%dx INCRBY (pipelined): %.3fs)\n",
                                 SUB84((double)(lVar7 - lVar6) / 1000000.0,0));
                          disconnect(c_00,0);
                          return;
                        }
                        iVar3 = redisGetReply(c_00,(void *)((long)pvVar5 + (long)t1._4_4_ * 8));
                        if (iVar3 != 0) break;
                        if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
                           (**(int **)((long)pvVar5 + (long)t1._4_4_ * 8) != 3)) {
                          __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                        ,0x31e,"void test_throughput(struct config)");
                        }
                        t1._4_4_ = t1._4_4_ + 1;
                      }
                      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                    ,0x31d,"void test_throughput(struct config)");
                    }
                    iVar3 = redisGetReply(c_00,(void *)((long)pvVar5 + (long)t1._4_4_ * 8));
                    if (iVar3 != 0) {
                      __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                    ,0x30f,"void test_throughput(struct config)");
                    }
                    if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
                       (**(int **)((long)pvVar5 + (long)t1._4_4_ * 8) != 2)) break;
                    if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
                       (*(long *)(*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) + 0x28) != 500)) {
                      __assert_fail("replies[i] != NULL && replies[i]->elements == 500",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                    ,0x311,"void test_throughput(struct config)");
                    }
                    t1._4_4_ = t1._4_4_ + 1;
                  }
                  __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                ,0x310,"void test_throughput(struct config)");
                }
                iVar3 = redisGetReply(c_00,(void *)((long)pvVar5 + (long)t1._4_4_ * 8));
                if (iVar3 != 0) {
                  __assert_fail("redisGetReply(c, (void*)&replies[i]) == REDIS_OK",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                                ,0x302,"void test_throughput(struct config)");
                }
                if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
                   (**(int **)((long)pvVar5 + (long)t1._4_4_ * 8) != 5)) break;
                t1._4_4_ = t1._4_4_ + 1;
              }
              __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                            ,0x303,"void test_throughput(struct config)");
            }
            uVar4 = redisCommand(c_00,"INCRBY incrkey %d",1000000);
            *(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8) = uVar4;
            if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
               (**(int **)((long)pvVar5 + (long)t1._4_4_ * 8) != 3)) break;
            t1._4_4_ = t1._4_4_ + 1;
          }
          __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                        ,0x2f5,"void test_throughput(struct config)");
        }
        uVar4 = redisCommand(c_00,"LRANGE mylist 0 499");
        *(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8) = uVar4;
        if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
           (**(int **)((long)pvVar5 + (long)t1._4_4_ * 8) != 2)) break;
        if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
           (*(long *)(*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) + 0x28) != 500)) {
          __assert_fail("replies[i] != NULL && replies[i]->elements == 500",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                        ,0x2ea,"void test_throughput(struct config)");
        }
        t1._4_4_ = t1._4_4_ + 1;
      }
      __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                    ,0x2e9,"void test_throughput(struct config)");
    }
    uVar4 = redisCommand(c_00,"PING");
    *(undefined8 *)((long)pvVar5 + (long)t1._4_4_ * 8) = uVar4;
    if ((*(long *)((long)pvVar5 + (long)t1._4_4_ * 8) == 0) ||
       (**(int **)((long)pvVar5 + (long)t1._4_4_ * 8) != 5)) break;
    t1._4_4_ = t1._4_4_ + 1;
  }
  __assert_fail("replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                ,0x2de,"void test_throughput(struct config)");
}

Assistant:

static void test_throughput(struct config config) {
    redisContext *c = do_connect(config);
    redisReply **replies;
    int i, num;
    long long t1, t2;

    test("Throughput:\n");
    for (i = 0; i < 500; i++)
        freeReplyObject(redisCommand(c,"LPUSH mylist foo"));

    num = 1000;
    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c,"PING");
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx PING: %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c,"LRANGE mylist 0 499");
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY);
        assert(replies[i] != NULL && replies[i]->elements == 500);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx LRANGE with 500 elements: %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    t1 = usec();
    for (i = 0; i < num; i++) {
        replies[i] = redisCommand(c, "INCRBY incrkey %d", 1000000);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx INCRBY: %.3fs)\n", num, (t2-t1)/1000000.0);

    num = 10000;
    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"PING");
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_STATUS);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx PING (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"LRANGE mylist 0 499");
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_ARRAY);
        assert(replies[i] != NULL && replies[i]->elements == 500);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx LRANGE with 500 elements (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    replies = malloc(sizeof(redisReply*)*num);
    for (i = 0; i < num; i++)
        redisAppendCommand(c,"INCRBY incrkey %d", 1000000);
    t1 = usec();
    for (i = 0; i < num; i++) {
        assert(redisGetReply(c, (void*)&replies[i]) == REDIS_OK);
        assert(replies[i] != NULL && replies[i]->type == REDIS_REPLY_INTEGER);
    }
    t2 = usec();
    for (i = 0; i < num; i++) freeReplyObject(replies[i]);
    free(replies);
    printf("\t(%dx INCRBY (pipelined): %.3fs)\n", num, (t2-t1)/1000000.0);

    disconnect(c, 0);
}